

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

path * __thiscall filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __return_storage_ptr__->m_type = native_path;
  (__return_storage_ptr__->m_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = this->m_absolute;
  __return_storage_ptr__->m_absolute = bVar1;
  __return_storage_ptr__->m_smb = this->m_smb;
  pbVar2 = (this->m_path).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->m_path).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    if (bVar1 == false) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"..",&local_49);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->m_path,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    lVar5 = 0;
    lVar4 = (long)pbVar3 - (long)pbVar2 >> 5;
    while (lVar4 = lVar4 + -1, lVar4 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->m_path,
                  (value_type *)
                  ((long)&(((this->m_path).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      lVar5 = lVar5 + 0x20;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path parent_path() const {
        path result;
        result.m_absolute = m_absolute;
        result.m_smb = m_smb;

        if (m_path.empty()) {
            if (!m_absolute)
                result.m_path.push_back("..");
        } else {
            size_t until = m_path.size() - 1;
            for (size_t i = 0; i < until; ++i)
                result.m_path.push_back(m_path[i]);
        }
        return result;
    }